

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_grow
          (t_of<0UL,_65536UL> *this,t_heap<xemmai::t_object> *a_heap)

{
  t_object *ptVar1;
  long lVar2;
  bool bVar3;
  unsigned_long length;
  t_object *local_30;
  unsigned_long local_28;
  
  local_28 = 0x800000;
  local_30 = (t_object *)f_map(0x800000);
  lVar2 = 0xffff;
  ptVar1 = local_30;
  while( true ) {
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar3) break;
    ptVar1->v_count = 1;
    ptVar1->v_next = ptVar1 + 1;
    ptVar1->v_rank = 0;
    ptVar1 = ptVar1 + 1;
  }
  ptVar1->v_count = 1;
  ptVar1->v_rank = 0;
  local_30->v_cyclic = 0x10000;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(a_heap + 0x38))->__data);
  std::
  _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
  ::_M_emplace_unique<xemmai::t_object*&,unsigned_long&>
            ((_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,unsigned_long>,std::_Select1st<std::pair<xemmai::t_object*const,unsigned_long>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
              *)(a_heap + 8),&local_30,&local_28);
  pthread_mutex_unlock((pthread_mutex_t *)(a_heap + 0x38));
  LOCK();
  (this->v_grown).super___atomic_base<unsigned_long>._M_i =
       (this->v_grown).super___atomic_base<unsigned_long>._M_i + 0x10000;
  UNLOCK();
  (**(code **)a_heap)();
  return local_30;
}

Assistant:

T* f_grow(t_heap& a_heap)
		{
			auto size = c_UNIT << A_rank;
			auto length = size * A_size;
			auto block = static_cast<char*>(f_map(length));
			auto p = block;
			for (size_t i = 1; i < A_size; ++i) {
				auto q = new(p) T;
				q->v_next = reinterpret_cast<T*>(p += size);
				q->v_rank = A_rank;
			}
			auto q = new(p) T;
			q->v_rank = A_rank;
			q = reinterpret_cast<T*>(block);
			q->v_cyclic = A_size;
			{
				std::lock_guard lock(a_heap.v_mutex);
				a_heap.v_blocks.emplace(q, length);
			}
			v_grown.fetch_add(A_size, std::memory_order_relaxed);
			a_heap.v_tick();
			return q;
		}